

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O3

S2LatLngRect * __thiscall
S2Polyline::GetRectBound(S2LatLngRect *__return_storage_ptr__,S2Polyline *this)

{
  S2Point *b;
  int k;
  S2LatLngRectBounder local_78;
  
  local_78.a_.c_[2] = 0.0;
  local_78.a_latlng_.coords_.c_[0] = 0.0;
  local_78.a_.c_[0] = 0.0;
  local_78.a_.c_[1] = 0.0;
  local_78.a_latlng_.coords_.c_[1] = 0.0;
  local_78.bound_.super_S2Region._vptr_S2Region = (_func_int **)&PTR__S2Region_002bc088;
  local_78.bound_.lat_.bounds_.c_[0] = 1.0;
  local_78.bound_.lat_.bounds_.c_[1] = 0.0;
  local_78.bound_.lng_.bounds_.c_[0] = 3.141592653589793;
  local_78.bound_.lng_.bounds_.c_[1] = -3.141592653589793;
  if (0 < this->num_vertices_) {
    k = 0;
    do {
      b = vertex(this,k);
      S2LatLngRectBounder::AddPoint(&local_78,b);
      k = k + 1;
    } while (k < this->num_vertices_);
  }
  S2LatLngRectBounder::GetBound(__return_storage_ptr__,&local_78);
  return __return_storage_ptr__;
}

Assistant:

S2LatLngRect S2Polyline::GetRectBound() const {
  S2LatLngRectBounder bounder;
  for (int i = 0; i < num_vertices(); ++i) {
    bounder.AddPoint(vertex(i));
  }
  return bounder.GetBound();
}